

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionDefinition
          (ExpressionContext *ctx,SynBase *source,bool prototype,bool coroutine,TypeBase *parentType
          ,bool accessor,TypeBase *returnType,bool isOperator,SynIdentifier *name,
          IntrusiveList<SynIdentifier> aliases,IntrusiveList<SynFunctionArgument> arguments,
          IntrusiveList<SynBase> expressions,FunctionData *genericProto,TypeFunction *instance,
          IntrusiveList<MatchData> matches)

{
  InplaceStr *pIVar1;
  TypeClass *classType;
  long lVar2;
  FunctionData *pFVar3;
  Node *pNVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  IntrusiveList<MatchData> generics_00;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  TypeBase *pTVar12;
  TypeGenericAlias *pTVar13;
  undefined4 extraout_var;
  TypeRef *pTVar15;
  ArgumentData *pAVar16;
  TypeFunction *pTVar17;
  VariableData *pVVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FunctionData *pFVar19;
  ExprError *this;
  undefined4 extraout_var_03;
  ArgumentData *pAVar20;
  undefined4 extraout_var_04;
  size_t sVar21;
  undefined4 extraout_var_05;
  SynBase *pSVar22;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ExprBase *pEVar23;
  TypeBase *pTVar24;
  undefined4 extraout_var_08;
  _func_int **pp_Var25;
  ExprBase *pEVar26;
  SynBase *pSVar27;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  VariableHandle *pVVar28;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_00;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar29;
  FunctionLookupChain *pFVar30;
  undefined4 extraout_var_14;
  undefined7 in_register_00000009;
  TypeBase *pTVar31;
  IntrusiveList<MatchData> *pIVar32;
  undefined7 in_register_00000011;
  SynFunctionArgument *extraout_RDX;
  char *pcVar33;
  SynIdentifier *pSVar34;
  uint i_2;
  SynIdentifier *pSVar35;
  ExpressionContext *pEVar36;
  ScopeData *pSVar37;
  undefined7 in_register_00000089;
  uint i_1;
  SmallArray<ArgumentData,_4U> *this_01;
  uint i;
  IntrusiveList<SynBase> *pIVar38;
  ArrayView<ArgumentData> argData_00;
  IntrusiveList<SynFunctionArgument> arguments_00;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr IVar39;
  FunctionData *function;
  char local_2b1;
  ExpressionContext *local_2b0;
  ExpressionContext *local_2a8;
  TypeBase *local_2a0;
  SynIdentifier *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  ExprVariableDefinition *local_288;
  TypeRef *local_280;
  InplaceStr parentName;
  InplaceStr functionName;
  FunctionLookupChain local_248;
  IntrusiveList<ExprBase> code;
  IntrusiveList<MatchData> local_208;
  TraceScope traceScope;
  IntrusiveList<ExprVariableDefinition> variables;
  IntrusiveList<MatchData> generics;
  SmallArray<ArgumentData,_8U> argData;
  MatchData *pMVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_09;
  undefined4 extraout_var_13;
  
  local_288 = (ExprVariableDefinition *)
              CONCAT44(local_288._4_4_,(int)CONCAT71(in_register_00000089,accessor));
  local_290 = (undefined4)CONCAT71(in_register_00000011,prototype);
  local_28c = (undefined4)CONCAT71(in_register_00000009,coroutine);
  local_298 = name;
  if ((name->super_SynBase).begin == (Lexeme *)0x0) {
    local_298 = (SynIdentifier *)source;
  }
  local_2b0 = (ExpressionContext *)source;
  local_2b1 = RestoreParentTypeScope(ctx,source,parentType);
  local_2a0 = ctx->scope->ownerType;
  if (local_2a0 == (TypeBase *)0x0) {
    local_2a0 = parentType;
  }
  if (parentType != (TypeBase *)0x0) {
    local_2a0 = parentType;
  }
  local_2a8 = ctx;
  if (local_2a0 != (TypeBase *)0x0 && coroutine) {
    pcVar33 = "ERROR: coroutine cannot be a member function";
    pSVar35 = local_298;
LAB_001d752e:
    anon_unknown.dwarf_ff84f::Stop(local_2a8,&pSVar35->super_SynBase,pcVar33);
  }
  generics.head = (MatchData *)0x0;
  generics.tail = (MatchData *)0x0;
  pSVar35 = aliases.head;
  while (pSVar35 != (SynIdentifier *)0x0) {
    pIVar1 = &pSVar35->name;
    uVar8 = InplaceStr::hash(pIVar1);
    pTVar12 = anon_unknown.dwarf_ff84f::LookupTypeByName(ctx,uVar8);
    pSVar34 = aliases.head;
    if (pTVar12 != (TypeBase *)0x0) {
      pcVar33 = "ERROR: there is already a type with the same name";
      goto LAB_001d752e;
    }
    while ((pSVar34 != (SynIdentifier *)0x0 && (pSVar34 != pSVar35))) {
      bVar7 = InplaceStr::operator==(&pSVar34->name,pIVar1);
      if (bVar7) {
        pcVar33 = "ERROR: there is already an alias with the same name";
        goto LAB_001d752e;
      }
      pSVar34 = (SynIdentifier *)(pSVar34->super_SynBase).next;
      if ((pSVar34 == (SynIdentifier *)0x0) || ((pSVar34->super_SynBase).typeID != 4)) {
        pSVar34 = (SynIdentifier *)0x0;
      }
    }
    pIVar32 = &matches;
    while (pMVar14 = pIVar32->head, pMVar14 != (MatchData *)0x0) {
      bVar7 = InplaceStr::operator==(pIVar1,&pMVar14->name->name);
      if (bVar7) {
        pTVar13 = (TypeGenericAlias *)pMVar14->type;
        if (pTVar13 != (TypeGenericAlias *)0x0) goto LAB_001d62da;
        break;
      }
      pIVar32 = (IntrusiveList<MatchData> *)&pMVar14->next;
    }
    pTVar13 = ExpressionContext::GetGenericAliasType(local_2a8,pSVar35);
LAB_001d62da:
    ctx = local_2a8;
    iVar9 = (*local_2a8->allocator->_vptr_Allocator[2])(local_2a8->allocator,0x20);
    pMVar14 = (MatchData *)CONCAT44(extraout_var,iVar9);
    pMVar14->name = pSVar35;
    pMVar14->type = &pTVar13->super_TypeBase;
    pMVar14->next = (MatchData *)0x0;
    pMVar14->listed = false;
    IntrusiveList<MatchData>::push_back(&generics,pMVar14);
    pSVar35 = (SynIdentifier *)(pSVar35->super_SynBase).next;
    if ((pSVar35 == (SynIdentifier *)0x0) || ((pSVar35->super_SynBase).typeID != 4)) {
      pSVar35 = (SynIdentifier *)0x0;
    }
  }
  SmallArray<ArgumentData,_8U>::SmallArray(&argData,ctx->allocator);
  pTVar12 = local_2a0;
  arguments_00.tail = extraout_RDX;
  arguments_00.head = arguments.head;
  AnalyzeFunctionDefinitionArguments(ctx,arguments_00,local_2a0,instance,&argData);
  if (isOperator) {
    argData_00.count = argData.count;
    argData_00.data = argData.data;
    argData_00._12_4_ = 0;
    CheckOperatorName(ctx,(SynBase *)local_2b0,name->name,argData_00);
  }
  if (((char)local_288 != '\0') &&
     (bVar7 = InplaceStr::operator==(&name->name,&pTVar12->name), bVar7)) {
    anon_unknown.dwarf_ff84f::Stop
              (ctx,&local_298->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  bVar7 = (bool)(char)local_288;
  local_288 = (ExprVariableDefinition *)CONCAT44(local_288._4_4_,(uint)(byte)(char)local_288);
  functionName = GetFunctionName(ctx,ctx->scope,pTVar12,name->name,isOperator,bVar7);
  if ((CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
       ::token == '\0') &&
     (iVar9 = __cxa_guard_acquire(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                                   ::token), iVar9 != 0)) {
    CreateFunctionDefinition::token = NULLC::TraceGetToken("analyze","CreateFunctionDefinition");
    __cxa_guard_release(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                         ::token);
    ctx = local_2a8;
    pTVar12 = local_2a0;
  }
  NULLC::TraceScope::TraceScope(&traceScope,CreateFunctionDefinition::token);
  NULLC::TraceLabel(functionName.begin,functionName.end);
  if (pTVar12 == (TypeBase *)0x0) {
    if (((char)local_28c == '\0') &&
       ((ctx->scope == ctx->globalScope || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)))) {
      pTVar12 = ctx->typeVoid;
    }
    else {
      pTVar12 = CreateFunctionContextType(ctx,(SynBase *)local_2b0,functionName);
    }
    pTVar15 = ExpressionContext::GetReferenceType(ctx,pTVar12);
  }
  else {
    pTVar15 = ExpressionContext::GetReferenceType(ctx,pTVar12);
  }
  if ((returnType != (TypeBase *)0x0) && (returnType->typeID == 0)) {
    if (local_2b1 != '\0') {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    }
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this = (ExprError *)CONCAT44(extraout_var_03,iVar9);
    pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError(this,(SynBase *)local_2b0,pTVar12);
    goto LAB_001d74f0;
  }
  pIVar1 = &name->name;
  local_280 = pTVar15;
  for (uVar8 = 0; uVar8 < argData.count; uVar8 = uVar8 + 1) {
    pAVar16 = SmallArray<ArgumentData,_8U>::operator[](&argData,uVar8);
    if ((pAVar16->type != (TypeBase *)0x0) && (pAVar16->type->typeID == 0)) {
      if (local_2b1 != '\0') {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      this = (ExprError *)CONCAT44(extraout_var_02,iVar9);
      pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError(this,(SynBase *)local_2b0,pTVar12);
      goto LAB_001d74f0;
    }
  }
  arguments_01.count = argData.count;
  arguments_01.data = argData.data;
  arguments_01._12_4_ = 0;
  pTVar17 = ExpressionContext::GetFunctionType(ctx,(SynBase *)local_2b0,returnType,arguments_01);
  pTVar12 = local_2a0;
  if (pTVar17 != instance && instance != (TypeFunction *)0x0) {
    __assert_fail("functionType == instance",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x236c,
                  "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                 );
  }
  uVar8 = InplaceStr::hash(&functionName);
  pVVar18 = anon_unknown.dwarf_ff84f::LookupVariableByName(ctx,uVar8);
  if ((pVVar18 != (VariableData *)0x0) && (pVVar18->scope == ctx->scope)) {
    anon_unknown.dwarf_ff84f::Stop
              (ctx,&local_298->super_SynBase,
               "ERROR: name \'%.*s\' is already taken for a variable in current scope",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x18)) {
    parentName.end = "";
    parentName.begin = "finalize";
    bVar7 = InplaceStr::operator==(pIVar1,&parentName);
    if (bVar7) {
      *(undefined1 *)((long)&pTVar12[3]._vptr_TypeBase + 2) = 1;
    }
  }
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_00,iVar9),name,functionName);
  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  pFVar19 = (FunctionData *)CONCAT44(extraout_var_01,iVar10);
  uVar8 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar8 + 1;
  pcVar33 = (char *)(ulong)(byte)(char)local_28c;
  generics_00.tail = generics.tail;
  generics_00.head = generics.head;
  FunctionData::FunctionData
            (pFVar19,ctx->allocator,(SynBase *)local_2b0,ctx->scope,(bool)(char)local_28c,
             SUB81(local_288,0),isOperator,pTVar17,&local_280->super_TypeBase,
             (SynIdentifier *)CONCAT44(extraout_var_00,iVar9),generics_00,uVar8);
  (pFVar19->aliases).head = matches.head;
  (pFVar19->aliases).tail = matches.tail;
  function = pFVar19;
  for (uVar8 = 0; uVar8 < argData.count; uVar8 = uVar8 + 1) {
    this_01 = &function->arguments;
    pAVar16 = SmallArray<ArgumentData,_8U>::operator[](&argData,uVar8);
    SmallArray<ArgumentData,_4U>::push_back(this_01,pAVar16);
  }
  if (pTVar17->returnType == ctx->typeAuto) {
    pFVar19 = (FunctionData *)0x0;
  }
  else {
    pFVar19 = anon_unknown.dwarf_ff84f::ImplementPrototype(ctx,function);
    if (pFVar19 == (FunctionData *)0x0) {
      pFVar19 = (FunctionData *)0x0;
    }
    else {
      if ((char)local_290 != '\0') {
        pcVar33 = "ERROR: function is already defined";
LAB_001d76d3:
        anon_unknown.dwarf_ff84f::Stop(local_2a8,&local_298->super_SynBase,pcVar33);
      }
      if ((char)local_28c == '\0') {
        if (pFVar19->coroutine != false) {
          pcVar33 = "ERROR: function prototype was a coroutine";
          goto LAB_001d76d3;
        }
      }
      else if (pFVar19->coroutine == false) {
        pcVar33 = "ERROR: function prototype was not a coroutine";
        goto LAB_001d76d3;
      }
      function->contextType = pFVar19->contextType;
      for (uVar8 = 0; uVar8 < (function->arguments).count; uVar8 = uVar8 + 1) {
        pAVar16 = SmallArray<ArgumentData,_4U>::operator[](&pFVar19->arguments,uVar8);
        pAVar20 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,uVar8);
        if (pAVar16->value != (ExprBase *)0x0) {
          if (pAVar20->value == (ExprBase *)0x0) {
            pAVar20->value = pAVar16->value;
          }
          else {
            anon_unknown.dwarf_ff84f::Report
                      (ctx,&local_298->super_SynBase,
                       "ERROR: function prototype already has a default value for argument #%d",
                       (ulong)(uVar8 + 1));
          }
        }
      }
    }
  }
  pTVar12 = local_2a0;
  IVar39.end = pcVar33;
  IVar39.begin = (function->name->name).end;
  anon_unknown.dwarf_ff84f::CheckFunctionConflict
            ((anon_unknown_dwarf_ff84f *)ctx,local_2b0,(SynBase *)(function->name->name).begin,
             IVar39);
  pEVar36 = ctx;
  ExpressionContext::AddFunction(ctx,function);
  pFVar3 = function;
  bVar7 = ExpressionContext::IsGenericFunction(pEVar36,function);
  if (bVar7) {
    if (instance != (TypeFunction *)0x0) {
      __assert_fail("!instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23af,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    if ((char)local_290 != '\0') {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,&local_298->super_SynBase,"ERROR: generic function cannot be forward-declared")
      ;
    }
    if (local_2b1 != '\0') {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    }
    if ((local_2b0 == (ExpressionContext *)0x0) || (*(uint *)&local_2b0->code != 0x37)) {
      __assert_fail("isType<SynFunctionDefinition>(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23b7,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    function->definition = (SynFunctionDefinition *)local_2b0;
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprError *)CONCAT44(extraout_var_04,iVar9);
    pTVar17 = function->type;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).typeID = 0x25;
    (this->super_ExprBase).source = (SynBase *)local_2b0;
    (this->super_ExprBase).type = &pTVar17->super_TypeBase;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3cc8;
    (this->values).data = (ExprBase **)function;
    (this->values).count = 0;
    (this->values).max = 0;
    (this->values).little[0] = (ExprBase *)0x0;
    function->declaration = (ExprBase *)this;
    if (((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID != 0x18)) ||
       (pcVar33 = strstr((function->name->name).begin,"::"), pcVar33 == (char *)0x0))
    goto LAB_001d74f0;
    SmallArray<FunctionData_*,_4U>::push_back
              ((SmallArray<FunctionData_*,_4U> *)&pTVar12[3].name,&function);
    parentName.begin = pcVar33 + 2;
    sVar21 = strlen(pcVar33 + 2);
    parentName.end = pcVar33 + sVar21 + 2;
    uVar8 = InplaceStr::hash(&parentName);
    DirectChainedMap<FunctionData_*>::insert
              ((DirectChainedMap<FunctionData_*> *)&pTVar12[3].arrayTypes,uVar8,function);
  }
  else {
    if (isOperator) {
      pSVar37 = ctx->scope;
      if ((pSVar37->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
        pSVar37 = ctx->globalScope;
      }
      DirectChainedMap<IdentifierLookupResult>::remove
                (&pSVar37->idLookupMap,(char *)(ulong)pFVar3->nameHash);
    }
    if (genericProto != (FunctionData *)0x0) {
      function->proto = genericProto;
      SmallArray<FunctionData_*,_8U>::push_back(&genericProto->instances,&function);
    }
    ExpressionContext::PushScope(ctx,function);
    function->functionScope = ctx->scope;
    pIVar32 = &function->aliases;
    while (pEVar36 = local_2b0, pMVar14 = pIVar32->head, pMVar14 != (MatchData *)0x0) {
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pSVar35 = pMVar14->name;
      pTVar12 = pMVar14->type;
      uVar8 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar8 + 1;
      AliasData::AliasData
                ((AliasData *)CONCAT44(extraout_var_05,iVar9),(SynBase *)local_2b0,ctx->scope,
                 pTVar12,pSVar35,uVar8);
      ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_05,iVar9));
      pIVar32 = (IntrusiveList<MatchData> *)&pMVar14->next;
    }
    variables.head = (ExprVariableDefinition *)0x0;
    variables.tail = (ExprVariableDefinition *)0x0;
    arguments_02.count = argData.count;
    arguments_02.data = argData.data;
    arguments_02._12_4_ = 0;
    CreateFunctionArgumentVariables(ctx,(SynBase *)local_2b0,function,arguments_02,&variables);
    pSVar22 = &ExpressionContext::MakeInternal(ctx,(SynBase *)pEVar36)->super_SynBase;
    pTVar12 = local_2a0;
    local_288 = CreateFunctionContextArgument(ctx,pSVar22,function);
    function->argumentsSize = function->functionScope->dataSize;
    code.head = (ExprBase *)0x0;
    code.tail = (ExprBase *)0x0;
    if ((char)local_290 == '\0') {
      if (function->coroutine == true) {
        uVar11 = anon_unknown.dwarf_ff84f::AllocateVariableInScope
                           (ctx,(SynBase *)local_2b0,ctx->typeInt->alignment,ctx->typeInt);
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_00.end = "";
        name_00.begin = "$jmpOffset";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_06,iVar9),name_00);
        iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar18 = (VariableData *)CONCAT44(extraout_var_07,iVar10);
        uVar8 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar8 + 1;
        VariableData::VariableData
                  (pVVar18,ctx->allocator,(SynBase *)local_2b0,ctx->scope,0,ctx->typeInt,
                   (SynIdentifier *)CONCAT44(extraout_var_06,iVar9),uVar11,uVar8);
        function->coroutineJumpOffset = pVVar18;
        bVar7 = anon_unknown.dwarf_ff84f::IsLookupOnlyVariable(ctx,pVVar18);
        if (bVar7) {
          pVVar18->lookupOnly = true;
        }
        ExpressionContext::AddVariable(ctx,pVVar18,false);
        AddFunctionCoroutineVariable
                  (ctx,(SynBase *)local_2b0,function,function->coroutineJumpOffset);
        local_280 = (TypeRef *)
                    CreateVariableAccess
                              (ctx,(SynBase *)local_2b0,function->coroutineJumpOffset,true);
        pTVar12 = local_2a0;
      }
      else {
        local_280 = (TypeRef *)0x0;
      }
      classType = (TypeClass *)function->scope->ownerType;
      if ((classType != (TypeClass *)0x0) &&
         ((classType->super_TypeStruct).super_TypeBase.typeID == 0x18)) {
        parentName = GetTypeConstructorName(classType);
        bVar7 = InplaceStr::operator==(&parentName,pIVar1);
        if (bVar7) {
          CreateDefaultConstructorCode(ctx,(SynBase *)local_2b0,classType,&code);
        }
      }
      pIVar38 = &expressions;
      while (pSVar22 = pIVar38->head, pSVar22 != (SynBase *)0x0) {
        pEVar23 = AnalyzeStatement(ctx,pSVar22);
        IntrusiveList<ExprBase>::push_back(&code,pEVar23);
        pIVar38 = (IntrusiveList<SynBase> *)&pSVar22->next;
      }
      pTVar24 = function->type->returnType;
      if (pTVar24 == ctx->typeAuto) {
        pTVar17 = ExpressionContext::GetFunctionType
                            (ctx,(SynBase *)local_2b0,ctx->typeVoid,function->type->arguments);
        function->type = pTVar17;
        pTVar24 = pTVar17->returnType;
      }
      pTVar31 = ctx->typeVoid;
      if (pTVar24 != pTVar31) {
        if (function->hasExplicitReturn == false) {
          anon_unknown.dwarf_ff84f::Report
                    (ctx,&local_298->super_SynBase,
                     "ERROR: function must return a value of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(returnType->name).end - (int)(returnType->name).begin))
          ;
          pTVar24 = function->type->returnType;
          pTVar31 = ctx->typeVoid;
        }
        if (pTVar24 != pTVar31) goto LAB_001d6e65;
      }
      pSVar22 = &ExpressionContext::MakeInternal(ctx,(SynBase *)local_2b0)->super_SynBase;
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar23 = (ExprBase *)CONCAT44(extraout_var_08,iVar9);
      pTVar12 = ctx->typeVoid;
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pp_Var25 = (_func_int **)CONCAT44(extraout_var_09,iVar9);
      pTVar24 = ctx->typeVoid;
      *(undefined4 *)(pp_Var25 + 1) = 2;
      pp_Var25[2] = (_func_int *)pSVar22;
      pp_Var25[3] = (_func_int *)pTVar24;
      pp_Var25[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var25 + 5) = 0;
      *pp_Var25 = (_func_int *)&PTR__ExprBase_003e3b40;
      pEVar26 = CreateFunctionCoroutineStateUpdate(ctx,pSVar22,function,0);
      pSVar27 = &ExpressionContext::MakeInternal(ctx,pSVar22)->super_SynBase;
      pSVar27 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar27,function,ctx->scope);
      pEVar23->typeID = 0x1c;
      pEVar23->source = pSVar22;
      pEVar23->type = pTVar12;
      pEVar23->next = (ExprBase *)0x0;
      pEVar23->listed = false;
      pEVar23->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3670;
      pEVar23[1]._vptr_ExprBase = pp_Var25;
      *(ExprBase **)&pEVar23[1].typeID = pEVar26;
      pEVar23[1].source = pSVar27;
      IntrusiveList<ExprBase>::push_back(&code,pEVar23);
      pTVar12 = local_2a0;
    }
    else {
      if (function->type->returnType == ctx->typeAuto) {
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,&local_298->super_SynBase,
                   "ERROR: function prototype with unresolved return type");
      }
      function->isPrototype = true;
      local_280 = (TypeRef *)0x0;
    }
LAB_001d6e65:
    ClosePendingUpvalues(ctx,function);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    if (local_2b1 != '\0') {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    }
    if (pTVar12 == (TypeBase *)0x0) {
      if (((char)local_28c == '\0') &&
         ((ctx->scope == ctx->globalScope || (ctx->scope->ownerNamespace != (NamespaceData *)0x0))))
      goto LAB_001d6f69;
      if ((char)local_290 == '\0') {
        local_2a8 = (ExpressionContext *)
                    CreateFunctionContextVariable(ctx,(SynBase *)local_2b0,function,pFVar19);
        local_2a0 = (TypeBase *)
                    CreateFunctionContextVariableDefinition
                              (ctx,(SynBase *)local_2b0,function,pFVar19,(VariableData *)local_2a8);
      }
      else {
        pTVar12 = function->contextType;
        if ((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID != 0x12)) {
          __assert_fail("refType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x244c,
                        "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                       );
        }
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        IVar39 = GetFunctionContextVariableName(ctx,function,function->functionIndex);
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_10,iVar9),IVar39);
        iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        local_2a8 = (ExpressionContext *)CONCAT44(extraout_var_11,iVar10);
        uVar8 = pTVar12->alignment;
        uVar11 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar11 + 1;
        VariableData::VariableData
                  ((VariableData *)local_2a8,ctx->allocator,(SynBase *)local_2b0,ctx->scope,uVar8,
                   pTVar12,(SynIdentifier *)CONCAT44(extraout_var_10,iVar9),0,uVar11);
        *(undefined1 *)((local_2a8->uniqueDependencies).little + 1) = 1;
        *(undefined4 *)((long)(local_2a8->uniqueDependencies).little + 0xc) = 0xffffffff;
        ExpressionContext::AddVariable(ctx,(VariableData *)local_2a8,true);
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        local_2a0 = (TypeBase *)CONCAT44(extraout_var_12,iVar9);
        pTVar12 = ctx->typeVoid;
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pVVar28 = (VariableHandle *)CONCAT44(extraout_var_13,iVar9);
        pVVar28->source = (SynBase *)0x0;
        pVVar28->variable = (VariableData *)local_2a8;
        pVVar28->next = (VariableHandle *)0x0;
        pVVar28->listed = false;
        local_2a0->typeID = 0x1e;
        (local_2a0->name).begin = (char *)local_2b0;
        (local_2a0->name).end = (char *)pTVar12;
        local_2a0->importModule = (ModuleData *)0x0;
        *(bool *)&local_2a0->typeIndex = false;
        ((ExprBase *)&local_2a0->_vptr_TypeBase)->_vptr_ExprBase =
             (_func_int **)&PTR__ExprBase_003e34e8;
        local_2a0->size = (longlong)pVVar28;
        *(ExprBase **)&local_2a0->padding = (ExprBase *)0x0;
      }
    }
    else {
      parentName = pTVar12->name;
      if (pTVar12->typeID == 0x18) {
        if (*(long *)&pTVar12[2].typeIndex != 0) {
          parentName = *(InplaceStr *)(*(long *)&pTVar12[2].typeIndex + 0x10);
        }
        pcVar33 = strstr((function->name->name).begin,"::");
        if (pcVar33 != (char *)0x0) {
          SmallArray<FunctionData_*,_4U>::push_back
                    ((SmallArray<FunctionData_*,_4U> *)&pTVar12[3].name,&function);
          local_248.node.start = (Node *)(pcVar33 + 2);
          sVar21 = strlen((char *)local_248.node.start);
          local_248.node.node = (Node *)(pcVar33 + sVar21 + 2);
          uVar8 = InplaceStr::hash((InplaceStr *)&local_248);
          DirectChainedMap<FunctionData_*>::insert
                    ((DirectChainedMap<FunctionData_*> *)&pTVar12[3].arrayTypes,uVar8,function);
        }
      }
      bVar7 = InplaceStr::operator==(pIVar1,&parentName);
      if ((bVar7) && (function->type->returnType != ctx->typeVoid)) {
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,&local_298->super_SynBase,
                   "ERROR: type constructor return type must be \'void\'");
      }
LAB_001d6f69:
      local_2a8 = (ExpressionContext *)0x0;
      local_2a0 = (TypeBase *)0x0;
    }
    pFVar19 = anon_unknown.dwarf_ff84f::ImplementPrototype(ctx,function);
    if (pFVar19 != (FunctionData *)0x0) {
      pTVar12 = function->contextType;
      if ((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID != 0x12)) {
        __assert_fail("refType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2466,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      pTVar12 = (TypeBase *)pTVar12[1]._vptr_TypeBase;
      if (pTVar12 != ctx->typeVoid) {
        if ((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID != 0x18)) {
          __assert_fail("classType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x246c,
                        "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                       );
        }
        lVar2._0_4_ = pTVar12[1].typeID;
        lVar2._4_4_ = pTVar12[1].nameHash;
        if (lVar2 != 0) {
          anon_unknown.dwarf_ff84f::Report
                    (ctx,&local_298->super_SynBase,
                     "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                     (ulong)(uint)(*(int *)&(function->name->name).end -
                                  (int)(function->name->name).begin));
        }
      }
    }
    if (isOperator) {
      if ((ctx->scope->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
        pSVar37 = ctx->globalScope;
        uVar8 = InplaceStr::hash(&function->name->name);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = function;
        DirectChainedMap<IdentifierLookupResult>::insert
                  (&pSVar37->idLookupMap,uVar8,(IdentifierLookupResult)(auVar5 << 0x40));
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = function;
        DirectChainedMap<IdentifierLookupResult>::insert
                  (&ctx->scope->idLookupMap,function->nameHash,
                   (IdentifierLookupResult)(auVar6 << 0x40));
      }
      SmallDenseSet<TypePair,_TypePairHasher,_32U>::clear(&ctx->noAssignmentOperatorForTypePair);
      SmallDenseSet<TypePair,_TypePairHasher,_32U>::clear(&ctx->noIndexOperatorForTypePair);
      for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
        this_00 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                            (&ctx->noUnaryOperatorForTypePair,uVar8);
        SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::clear(this_00);
      }
      for (uVar8 = 0; uVar8 != 0x15; uVar8 = uVar8 + 1) {
        pSVar29 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                            (&ctx->noBinaryOperatorForTypePair,uVar8);
        SmallDenseSet<TypePair,_TypePairHasher,_4U>::clear(pSVar29);
      }
      for (uVar8 = 0; uVar8 != 0xb; uVar8 = uVar8 + 1) {
        pSVar29 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                            (&ctx->noModifyOperatorForTypePair,uVar8);
        SmallDenseSet<TypePair,_TypePairHasher,_4U>::clear(pSVar29);
      }
    }
    pFVar19 = function;
    uVar8 = InplaceStr::hash(&function->name->name);
    anon_unknown.dwarf_ff84f::LookupFunctionChainByName
              ((FunctionLookupChain *)&parentName,ctx,uVar8);
    while (parentName.end != (char *)0x0) {
      pFVar3 = *(FunctionData **)(parentName.end + 0x10);
      if (pFVar3 == (FunctionData *)0x0 || pFVar3 == pFVar19) {
        anon_unknown.dwarf_ff84f::FunctionLookupChain::next
                  (&local_248,(FunctionLookupChain *)&parentName);
      }
      else {
        local_248.node.start = (Node *)(pFVar3->generics).head;
        local_248.node.node = (Node *)(pFVar3->generics).tail;
        local_208.head = (pFVar19->generics).head;
        local_208.tail = (pFVar19->generics).tail;
        uVar8 = IntrusiveList<MatchData>::size((IntrusiveList<MatchData> *)&local_248);
        uVar11 = IntrusiveList<MatchData>::size(&local_208);
        if (uVar8 == uVar11) {
          pIVar32 = &local_208;
          pFVar30 = &local_248;
          while ((pNVar4 = (pFVar30->node).start, pNVar4 != (Node *)0x0 &&
                 (pMVar14 = pIVar32->head, pMVar14 != (MatchData *)0x0))) {
            if (*(TypeBase **)(pNVar4 + 8) != pMVar14->type) goto LAB_001d7355;
            pFVar30 = (FunctionLookupChain *)(pNVar4 + 0x10);
            pIVar32 = (IntrusiveList<MatchData> *)&pMVar14->next;
          }
          if ((pFVar3->type == pFVar19->type) &&
             (pFVar3->scope->ownerType == pFVar19->scope->ownerType)) {
            anon_unknown.dwarf_ff84f::Report
                      (ctx,&local_298->super_SynBase,
                       "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                       (ulong)(uint)(*(int *)&(function->name->name).end -
                                    (int)(function->name->name).begin));
            pcVar33 = ctx->errorBuf;
            sVar21 = strlen(pcVar33);
            pcVar33 = pcVar33 + sVar21;
            iVar9 = NULLC::SafeSprintf(pcVar33,(ulong)(ctx->errorBufSize - (int)sVar21),
                                       "previous definition here");
            anon_unknown.dwarf_ff84f::AddRelatedErrorInfoWithLocation
                      (ctx,pFVar3->source,pcVar33,pcVar33 + iVar9);
            break;
          }
        }
LAB_001d7355:
        anon_unknown.dwarf_ff84f::FunctionLookupChain::next
                  (&local_248,(FunctionLookupChain *)&parentName);
      }
      parentName.end = (char *)local_248.node.node;
      parentName.begin = (char *)local_248.node.start;
    }
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar23 = (ExprBase *)CONCAT44(extraout_var_14,iVar9);
    pTVar17 = function->type;
    local_248.node.start = (Node *)variables.head;
    local_248.node.node = (Node *)variables.tail;
    parentName.end = (char *)code.tail;
    parentName.begin = (char *)code.head;
    pEVar23->typeID = 0x24;
    pEVar23->source = (SynBase *)local_2b0;
    pEVar23->type = &pTVar17->super_TypeBase;
    pEVar23->next = (ExprBase *)0x0;
    pEVar23->listed = false;
    pEVar23->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e36a8;
    pEVar23[1]._vptr_ExprBase = (_func_int **)function;
    *(ExprVariableDefinition **)&pEVar23[1].typeID = local_288;
    pEVar23[1].source = (SynBase *)variables.head;
    pEVar23[1].type = (TypeBase *)variables.tail;
    pEVar23[1].next = (ExprBase *)local_280;
    *(ExprBase **)&pEVar23[1].listed = code.head;
    pEVar23[2]._vptr_ExprBase = (_func_int **)code.tail;
    *(TypeBase **)&pEVar23[2].typeID = local_2a0;
    pEVar23[2].source = (SynBase *)local_2a8;
    function->declaration = pEVar23;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&function->declaration);
  }
  this = (ExprError *)function->declaration;
LAB_001d74f0:
  NULLC::TraceScope::~TraceScope(&traceScope);
  SmallArray<ArgumentData,_8U>::~SmallArray(&argData);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionDefinition(ExpressionContext &ctx, SynBase *source, bool prototype, bool coroutine, TypeBase *parentType, bool accessor, TypeBase *returnType, bool isOperator, SynIdentifier *name, IntrusiveList<SynIdentifier> aliases, IntrusiveList<SynFunctionArgument> arguments, IntrusiveList<SynBase> expressions, FunctionData *genericProto, TypeFunction *instance, IntrusiveList<MatchData> matches)
{
	SynBase *errorLocation = name->begin ? name : source;

	bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

	if(ctx.scope->ownerType && !parentType)
		parentType = ctx.scope->ownerType;

	if(parentType && coroutine)
		Stop(ctx, errorLocation, "ERROR: coroutine cannot be a member function");

	IntrusiveList<MatchData> generics;

	for(SynIdentifier *curr = aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
	{
		if(LookupTypeByName(ctx, curr->name.hash()))
			Stop(ctx, curr, "ERROR: there is already a type with the same name");

		for(SynIdentifier *prev = aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
		{
			if(prev->name == curr->name)
				Stop(ctx, curr, "ERROR: there is already an alias with the same name");
		}

		TypeBase *target = NULL;

		for(MatchData *match = matches.head; match; match = match->next)
		{
			if(curr->name == match->name->name)
			{
				target = match->type;
				break;
			}
		}

		if(!target)
			target = ctx.GetGenericAliasType(curr);

		generics.push_back(new (ctx.get<MatchData>()) MatchData(curr, target));
	}

	SmallArray<ArgumentData, 8> argData(ctx.allocator);

	AnalyzeFunctionDefinitionArguments(ctx, arguments, parentType, instance, argData);

	// Check required operator properties
	if(isOperator)
		CheckOperatorName(ctx, source, name->name, argData);

	if(accessor && name->name == parentType->name)
		Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name->name));

	InplaceStr functionName = GetFunctionName(ctx, ctx.scope, parentType, name->name, isOperator, accessor);

	TRACE_SCOPE("analyze", "CreateFunctionDefinition");
	TRACE_LABEL2(functionName.begin, functionName.end);

	TypeBase *contextRefType = NULL;

	if(parentType)
		contextRefType = ctx.GetReferenceType(parentType);
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	if(isType<TypeError>(returnType))
	{
		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	for(unsigned i = 0; i < argData.size(); i++)
	{
		if(isType<TypeError>(argData[i].type))
		{
			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);

			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
		}
	}

	TypeFunction *functionType = ctx.GetFunctionType(source, returnType, argData);

	if(instance)
		assert(functionType == instance);

	if(VariableData *variable = LookupVariableByName(ctx, functionName.hash()))
	{
		if(variable->scope == ctx.scope)
			Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name->name));
	}

	if(TypeClass *classType = getType<TypeClass>(parentType))
	{
		if(name->name == InplaceStr("finalize"))
			classType->hasFinalizer = true;
	}

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name, functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, coroutine, accessor, isOperator, functionType, contextRefType, nameIdentifier, generics, ctx.uniqueFunctionId++);

	function->aliases = matches;

	// Fill in argument data
	for(unsigned i = 0; i < argData.size(); i++)
		function->arguments.push_back(argData[i]);

	FunctionData *implementedPrototype = NULL;

	// If the type is known, implement the prototype immediately
	if(functionType->returnType != ctx.typeAuto)
	{
		if(FunctionData *functionPrototype = ImplementPrototype(ctx, function))
		{
			if(prototype)
				Stop(ctx, errorLocation, "ERROR: function is already defined");

			if(coroutine && !functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was not a coroutine");

			if(!coroutine && functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was a coroutine");

			function->contextType = functionPrototype->contextType;

			// Assign default function arguments
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &protoArg = functionPrototype->arguments[i];
				ArgumentData &implArg = function->arguments[i];

				if(protoArg.value)
				{
					if(!implArg.value)
						implArg.value = protoArg.value;
					else
						Report(ctx, errorLocation, "ERROR: function prototype already has a default value for argument #%d", i + 1);
				}
			}

			implementedPrototype = functionPrototype;
		}
	}

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	if(ctx.IsGenericFunction(function))
	{
		assert(!instance);

		if(prototype)
			Stop(ctx, errorLocation, "ERROR: generic function cannot be forward-declared");

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		assert(isType<SynFunctionDefinition>(source));

		function->definition = getType<SynFunctionDefinition>(source);
		function->declaration = new (ctx.get<ExprGenericFunctionPrototype>()) ExprGenericFunctionPrototype(source, function->type, function);

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		return function->declaration;
	}

	// Operator overloads can't be called recursively and become available at the end of the definition
	if (isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	if(genericProto)
	{
		function->proto = genericProto;

		genericProto->instances.push_back(function);
	}

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	for(MatchData *curr = function->aliases.head; curr; curr = curr->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, curr->type, curr->name, ctx.uniqueAliasId++));

	IntrusiveList<ExprVariableDefinition> variables;

	CreateFunctionArgumentVariables(ctx, source, function, argData, variables);

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> code;

	if(prototype)
	{
		if(function->type->returnType == ctx.typeAuto)
			Stop(ctx, errorLocation, "ERROR: function prototype with unresolved return type");

		function->isPrototype = true;
	}
	else
	{
		if(function->coroutine)
		{
			unsigned offset = AllocateVariableInScope(ctx, source, ctx.typeInt->alignment, ctx.typeInt);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

			function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
				function->coroutineJumpOffset->lookupOnly = true;

			ctx.AddVariable(function->coroutineJumpOffset, false);

			AddFunctionCoroutineVariable(ctx, source, function, function->coroutineJumpOffset);

			coroutineStateRead = CreateVariableAccess(ctx, source, function->coroutineJumpOffset, true);
		}

		// If this is a custom default constructor, add a prolog
		if(TypeClass *classType = getType<TypeClass>(function->scope->ownerType))
		{
			if(GetTypeConstructorName(classType) == name->name)
				CreateDefaultConstructorCode(ctx, source, classType, code);
		}

		for(SynBase *expression = expressions.head; expression; expression = expression->next)
			code.push_back(AnalyzeStatement(ctx, expression));

		// If the function type is still auto it means that it hasn't returned anything
		if(function->type->returnType == ctx.typeAuto)
			function->type = ctx.GetFunctionType(source, ctx.typeVoid, function->type->arguments);

		if(function->type->returnType != ctx.typeVoid && !function->hasExplicitReturn)
			Report(ctx, errorLocation, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		// User might have not returned from all control paths, for a void function we will generate a return
		if(function->type->returnType == ctx.typeVoid)
		{
			SynBase *location = ctx.MakeInternal(source);

			code.push_back(new (ctx.get<ExprReturn>()) ExprReturn(location, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(location, ctx.typeVoid), CreateFunctionCoroutineStateUpdate(ctx, location, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(location), function, ctx.scope)));
		}
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	if(addedParentScope)
		ctx.PopScope(SCOPE_TYPE);

	if(parentType)
	{
		InplaceStr parentName = parentType->name;

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			if(typeClass->proto)
				parentName = typeClass->proto->name;

			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		if(name->name == parentName && function->type->returnType != ctx.typeVoid)
			Stop(ctx, errorLocation, "ERROR: type constructor return type must be 'void'");
	}

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(parentType)
	{
		contextVariableDefinition = NULL;
	}
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
	{
		contextVariableDefinition = NULL;
	}
	else if(prototype)
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		contextVariable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, 0, ctx.uniqueVariableId++);

		contextVariable->isAlloca = true;
		contextVariable->offset = ~0u;

		//function->contextVariable = context;

		ctx.AddVariable(contextVariable, true);

		contextVariableDefinition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, contextVariable), NULL);
	}
	else
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, implementedPrototype);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, implementedPrototype, contextVariable);
	}

	// If the type was deduced, implement prototype now that it's known
	if(ImplementPrototype(ctx, function))
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		if(refType->subType != ctx.typeVoid)
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			assert(classType);

			if(!classType->members.empty())
				Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));
		}
	}

	// Time to make operator overload visible
	if(isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.insert(function->nameHash, IdentifierLookupResult(function));

		// TODO: more precise invalidation
		ctx.noAssignmentOperatorForTypePair.clear();

		ctx.noIndexOperatorForTypePair.clear();

		for(unsigned i = 0; i < ctx.noUnaryOperatorForTypePair.size(); i++)
			ctx.noUnaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noBinaryOperatorForTypePair.size(); i++)
			ctx.noBinaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noModifyOperatorForTypePair.size(); i++)
			ctx.noModifyOperatorForTypePair[i].clear();
	}

	FunctionData *conflict = CheckUniqueness(ctx, function);

	if(conflict)
	{
		Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));

		char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

		const char *messageStart = errorCurr;

		errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "previous definition here");

		const char *messageEnd = errorCurr;

		AddRelatedErrorInfoWithLocation(ctx, conflict->source, messageStart, messageEnd);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, coroutineStateRead, code, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	return function->declaration;
}